

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O1

UBool __thiscall
icu_63::Normalizer2Impl::composeUTF8
          (Normalizer2Impl *this,uint32_t options,UBool onlyContiguous,uint8_t *src,uint8_t *limit,
          ByteSink *sink,Edits *edits,UErrorCode *errorCode)

{
  ushort *puVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  UCPTrie *pUVar5;
  ushort uVar6;
  byte bVar7;
  UBool UVar8;
  byte bVar9;
  UChar UVar10;
  uint uVar11;
  int32_t iVar12;
  UChar32 UVar13;
  ushort uVar14;
  uint uVar15;
  byte bVar16;
  int iVar17;
  int iVar18;
  uint newLength;
  uint uVar19;
  byte *pbVar20;
  byte *p;
  long lVar21;
  byte *pbVar22;
  bool bVar23;
  ReorderingBuffer buffer;
  UnicodeString s16;
  byte *local_f0;
  byte local_e1;
  byte local_e0;
  ReorderingBuffer local_b0;
  UnicodeString local_70;
  
  local_70.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_0024a818;
  local_70.fUnion.fStackFields.fLengthAndFlags = 2;
  UVar10 = this->minCompNoMaybeCP;
  if (0x7f < (ushort)UVar10) {
    local_e1 = 0xe0;
    if (0x7ff < (ushort)UVar10) goto LAB_001a96d0;
    UVar10 = (ushort)UVar10 >> 6 & 0xff | 0xc0;
  }
  local_e1 = (byte)UVar10;
LAB_001a96d0:
  bVar7 = (sink != (ByteSink *)0x0) * '\x05' + 1;
  bVar16 = bVar7;
  local_f0 = src;
joined_r0x001a9709:
  p = src;
  if (p == limit) {
    bVar16 = 1;
    bVar9 = 1;
    src = p;
    if ((sink != (ByteSink *)0x0) && (local_f0 != limit)) {
      ByteSinkUtil::appendUnchanged(local_f0,limit,sink,options,edits,errorCode);
    }
  }
  else {
    bVar9 = *p;
    uVar11 = (uint)bVar9;
    pbVar20 = p + 1;
    src = pbVar20;
    if (bVar9 < local_e1) goto joined_r0x001a9709;
    if ((char)bVar9 < '\0') {
      if (pbVar20 != limit) {
        uVar11 = (uint)bVar9;
        if (bVar9 < 0xe0) {
          if ((0xc1 < bVar9) && ((byte)(*pbVar20 ^ 0x80) < 0x40)) {
            uVar11 = (uint)this->normTrie->index[uVar11 & 0x1f] + (*pbVar20 ^ 0x80);
LAB_001a97d3:
            src = src + 1;
            goto LAB_001a985b;
          }
        }
        else if (bVar9 < 0xf0) {
          if (((((byte)" 000000000000\x1000"[uVar11 & 0xf] >> (*pbVar20 >> 5) & 1) != 0) &&
              (src = p + 2, src != limit)) && ((byte)(*src ^ 0x80) < 0x40)) {
            uVar11 = (uint)*(ushort *)
                            ((long)this->normTrie->index +
                            (ulong)((uVar11 & 0xf) * 0x80 + (*pbVar20 & 0x3f) * 2)) + (*src ^ 0x80);
            goto LAB_001a97d3;
          }
        }
        else if (bVar9 < 0xf5) {
          if ((((((uint)(int)""[*pbVar20 >> 4] >> (uVar11 - 0xf0 & 0x1f) & 1) != 0) &&
               (pbVar22 = p + 2, src = pbVar22, pbVar22 != limit)) &&
              ((byte)(*pbVar22 + 0x80) < 0x40)) &&
             ((src = p + 3, src != limit && ((byte)(*src + 0x80) < 0x40)))) {
            uVar11 = *pbVar20 & 0x3f | (uVar11 - 0xf0) * 0x40;
            pUVar5 = this->normTrie;
            if (uVar11 < pUVar5->shifted12HighStart) {
              uVar11 = ucptrie_internalSmallU8Index_63(pUVar5,uVar11,*pbVar22 + 0x80,*src + 0x80);
            }
            else {
              uVar11 = pUVar5->dataLength - 2;
            }
            goto LAB_001a97d3;
          }
        }
      }
      uVar11 = this->normTrie->dataLength - 1;
    }
LAB_001a985b:
    uVar3 = *(ushort *)((long)(this->normTrie->data).ptr0 + (long)(int)uVar11 * 2);
    if (uVar3 < this->minNoNo) goto joined_r0x001a9709;
    uVar11 = (uint)uVar3;
    iVar18 = (int)src;
    if (uVar3 < this->minMaybeYes) {
      if (sink == (ByteSink *)0x0) {
        bVar9 = 1;
        bVar16 = 0;
      }
      else {
        uVar14 = this->limitNoNo;
        uVar15 = (uint)p;
        if (uVar3 < uVar14) {
          if (this->minNoNoCompBoundaryBefore <= uVar3) {
            if ((uVar3 < this->minNoNoEmpty) ||
               ((UVar8 = hasCompBoundaryBefore(this,src,limit), UVar8 == '\0' &&
                (UVar8 = hasCompBoundaryAfter(this,local_f0,p,onlyContiguous), UVar8 == '\0'))))
            goto LAB_001aa069;
            if ((local_f0 != p) &&
               (UVar8 = ByteSinkUtil::appendUnchanged(local_f0,p,sink,options,edits,errorCode),
               UVar8 == '\0')) goto LAB_001aa3b9;
            bVar9 = 3;
            if (edits != (Edits *)0x0) {
              Edits::addReplace(edits,iVar18 - uVar15,0);
              local_f0 = src;
              goto LAB_001a98d2;
            }
LAB_001aa46a:
            bVar9 = 3;
            local_f0 = src;
            goto LAB_001a98d2;
          }
          if ((uVar3 & 1) == 0) {
LAB_001a9922:
            UVar8 = hasCompBoundaryBefore(this,src,limit);
            if (UVar8 == '\0') goto LAB_001aa069;
          }
          else if ((onlyContiguous != '\0') && (uVar3 != 1)) {
            if (uVar3 < uVar14) {
              bVar23 = *(ushort *)((long)this->extraData + (ulong)(uVar3 & 0xfffffffe)) < 0x200;
            }
            else {
              bVar23 = (uVar3 & 6) < 3;
            }
            if (!bVar23) goto LAB_001a9922;
          }
          if ((local_f0 == p) ||
             (UVar8 = ByteSinkUtil::appendUnchanged(local_f0,p,sink,options,edits,errorCode),
             UVar8 != '\0')) {
            puVar1 = (ushort *)((long)this->extraData + (ulong)(uVar11 & 0xfffffffe));
            UVar8 = ByteSinkUtil::appendChange
                              (p,src,(char16_t *)(puVar1 + 1),*puVar1 & 0x1f,sink,edits,errorCode);
            if (UVar8 != '\0') {
              local_f0 = src;
            }
            bVar9 = UVar8 == '\0' ^ 3;
            goto LAB_001a98d2;
          }
        }
        else {
          if ((uVar3 & 1) == 0) {
LAB_001a9a39:
            UVar8 = hasCompBoundaryBefore(this,src,limit);
            if (UVar8 == '\0') goto LAB_001aa069;
          }
          else if ((onlyContiguous != '\0') && (uVar3 != 1)) {
            if (uVar3 < uVar14) {
              bVar23 = *(ushort *)((long)this->extraData + (ulong)(uVar3 & 0xfffffffe)) < 0x200;
            }
            else {
              bVar23 = (uVar3 & 6) < 3;
            }
            if (!bVar23) goto LAB_001a9a39;
          }
          if ((local_f0 == p) ||
             (UVar8 = ByteSinkUtil::appendUnchanged(local_f0,p,sink,options,edits,errorCode),
             UVar8 != '\0')) {
            iVar17 = (uint)(uVar3 >> 3) - (uint)this->centerNoNoDelta;
            if (iVar18 - uVar15 == 1) {
              local_b0.impl = (Normalizer2Impl *)CONCAT71(local_b0.impl._1_7_,(char)iVar17 + *p);
              newLength = 1;
            }
            else {
              bVar9 = src[-1];
              if (((uint)bVar9 + iVar17 & 0xffffffc0) == 0x80) {
                pbVar20 = p + 1;
                if (p + 1 < src + -1) {
                  pbVar20 = src + -1;
                }
                memcpy(&local_b0,p,(long)pbVar20 - (long)p);
                newLength = ~uVar15 + (int)pbVar20 + 2;
                *(char *)((long)&local_b0.impl + ((long)pbVar20 - (long)p & 0xffffffffU)) =
                     (char)((uint)bVar9 + iVar17);
              }
              else {
                UVar13 = anon_unknown_20::codePointFromValidUTF8(p,src);
                uVar11 = UVar13 + iVar17;
                if (uVar11 < 0x80) {
                  local_b0.impl = (Normalizer2Impl *)CONCAT71(local_b0.impl._1_7_,(byte)uVar11);
                  newLength = 1;
                }
                else {
                  if (uVar11 < 0x800) {
                    local_b0.impl =
                         (Normalizer2Impl *)
                         (CONCAT71(local_b0.impl._1_7_,(char)(uVar11 >> 6)) | 0xc0);
                    uVar19 = 1;
                  }
                  else {
                    if (uVar11 < 0x10000) {
                      local_b0.impl =
                           (Normalizer2Impl *)
                           (CONCAT71(local_b0.impl._1_7_,(char)(uVar11 >> 0xc)) | 0xe0);
                      lVar21 = 1;
                    }
                    else {
                      local_b0.impl =
                           (Normalizer2Impl *)
                           (CONCAT62(local_b0.impl._2_6_,
                                     CONCAT11((char)(uVar11 >> 0xc),(char)(uVar11 >> 0x12))) &
                            0xffffffffffff3fff | 0x80f0);
                      lVar21 = 2;
                    }
                    uVar19 = (int)lVar21 + 1;
                    *(byte *)((long)&local_b0.impl + lVar21) = (byte)(uVar11 >> 6) & 0x3f | 0x80;
                  }
                  newLength = uVar19 + 1;
                  *(byte *)((long)&local_b0.impl + (ulong)uVar19) = (byte)uVar11 & 0x3f | 0x80;
                }
              }
            }
            if (edits != (Edits *)0x0) {
              Edits::addReplace(edits,iVar18 - uVar15,newLength);
            }
            (*sink->_vptr_ByteSink[2])(sink,&local_b0,(ulong)newLength);
            goto LAB_001aa46a;
          }
        }
LAB_001aa3b9:
        bVar9 = 2;
      }
    }
    else {
      if (uVar11 == 0xfe00) {
        if ((long)p - (long)local_f0 < 3) {
LAB_001a9a5d:
          uVar11 = 0xffffffff;
        }
        else {
          bVar9 = p[-3];
          uVar11 = (uint)bVar9;
          bVar23 = true;
          if ((byte)(bVar9 + 0x1f) < 0xd) {
            uVar15 = p[-2] ^ 0x80;
            if ((((byte)uVar15 < 0x40) && ((byte)(p[-1] ^ 0x80) < 0x40)) &&
               ((bVar9 < 0xed || (uVar11 = uVar15, (byte)uVar15 < 0x20)))) {
              uVar11 = uVar15 << 6 | (bVar9 & 0xf) << 0xc | p[-1] ^ 0x80;
              bVar23 = false;
            }
          }
          if (bVar23) goto LAB_001a9a5d;
        }
        if (*pbVar20 == 0x85) {
          if (uVar11 - 0x1100 < 0x13) {
            if (sink == (ByteSink *)0x0) {
LAB_001a9e21:
              bVar9 = 1;
              bVar23 = false;
              bVar16 = 0;
              goto LAB_001aa061;
            }
            iVar12 = anon_unknown_20::getJamoTMinusBase(src,limit);
            if (iVar12 < 0) {
              UVar8 = hasCompBoundaryBefore(this,src,limit);
              if (UVar8 != '\0') {
                iVar12 = 0;
              }
            }
            else {
              src = src + 3;
            }
            if (-1 < iVar12) {
              bVar9 = p[2];
              pbVar20 = p + -3;
              if ((local_f0 != pbVar20) &&
                 (UVar8 = ByteSinkUtil::appendUnchanged
                                    (local_f0,pbVar20,sink,options,edits,errorCode), UVar8 == '\0'))
              goto LAB_001aa106;
              ByteSinkUtil::appendCodePoint
                        ((int)src - (int)pbVar20,
                         iVar12 + (uVar11 - 0x1100) * 0x24c + (uint)bVar9 * 0x1c + 0x9a64,sink,edits
                        );
LAB_001aa04d:
              p = p + -3;
              bVar9 = 3;
              bVar23 = false;
              local_f0 = src;
              goto LAB_001aa061;
            }
          }
LAB_001aa05f:
          bVar9 = 0;
          bVar23 = true;
        }
        else {
          if ((0x2ba3 < uVar11 - 0xac00) || ((uVar11 - 0xac00) % 0x1c != 0)) goto LAB_001aa05f;
          if (sink == (ByteSink *)0x0) goto LAB_001a9e21;
          iVar12 = anon_unknown_20::getJamoTMinusBase(p,src);
          pbVar20 = p + -3;
          if ((local_f0 == pbVar20) ||
             (UVar8 = ByteSinkUtil::appendUnchanged(local_f0,pbVar20,sink,options,edits,errorCode),
             UVar8 != '\0')) {
            ByteSinkUtil::appendCodePoint(iVar18 - (int)pbVar20,iVar12 + uVar11,sink,edits);
            goto LAB_001aa04d;
          }
LAB_001aa106:
          p = p + -3;
          bVar9 = 2;
          bVar23 = false;
        }
LAB_001aa061:
        if (!bVar23) goto LAB_001a98d2;
      }
      else if (0xfe00 < uVar11) {
        uVar14 = uVar3 >> 1;
        if ((onlyContiguous == '\0') ||
           (bVar9 = getPreviousTrailCC(this,local_f0,p), bVar9 <= (byte)uVar14)) {
          do {
            if (src == limit) {
              bVar16 = 1;
              bVar9 = 1;
              if (sink != (ByteSink *)0x0) {
                ByteSinkUtil::appendUnchanged(local_f0,limit,sink,options,edits,errorCode);
              }
              goto LAB_001a9ea0;
            }
            pbVar20 = src + 1;
            bVar9 = *src;
            uVar11 = (uint)bVar9;
            if ((char)bVar9 < '\0') {
              if (pbVar20 != limit) {
                uVar11 = (uint)bVar9;
                if (bVar9 < 0xe0) {
                  if ((0xc1 < bVar9) && ((byte)(*pbVar20 ^ 0x80) < 0x40)) {
                    uVar11 = (uint)this->normTrie->index[uVar11 & 0x1f] + (*pbVar20 ^ 0x80);
LAB_001a9c1a:
                    pbVar20 = pbVar20 + 1;
                    goto LAB_001a9ca2;
                  }
                }
                else if (bVar9 < 0xf0) {
                  bVar9 = *pbVar20;
                  if (((((byte)" 000000000000\x1000"[uVar11 & 0xf] >> (bVar9 >> 5) & 1) != 0) &&
                      (pbVar20 = src + 2, pbVar20 != limit)) && ((byte)(*pbVar20 ^ 0x80) < 0x40)) {
                    uVar11 = (uint)*(ushort *)
                                    ((long)this->normTrie->index +
                                    (ulong)((uVar11 & 0xf) * 0x80 + (bVar9 & 0x3f) * 2)) +
                             (*pbVar20 ^ 0x80);
                    goto LAB_001a9c1a;
                  }
                }
                else if (bVar9 < 0xf5) {
                  bVar9 = *pbVar20;
                  if ((((((uint)(int)""[bVar9 >> 4] >> (uVar11 - 0xf0 & 0x1f) & 1) != 0) &&
                       (pbVar20 = src + 2, pbVar20 != limit)) &&
                      (bVar2 = *pbVar20, (byte)(bVar2 + 0x80) < 0x40)) &&
                     ((pbVar20 = src + 3, pbVar20 != limit && ((byte)(*pbVar20 + 0x80) < 0x40)))) {
                    uVar11 = bVar9 & 0x3f | (uVar11 - 0xf0) * 0x40;
                    pUVar5 = this->normTrie;
                    if (uVar11 < pUVar5->shifted12HighStart) {
                      uVar11 = ucptrie_internalSmallU8Index_63
                                         (pUVar5,uVar11,bVar2 + 0x80,*pbVar20 + 0x80);
                    }
                    else {
                      uVar11 = pUVar5->dataLength - 2;
                    }
                    goto LAB_001a9c1a;
                  }
                }
              }
              uVar11 = this->normTrie->dataLength - 1;
            }
LAB_001a9ca2:
            uVar4 = *(ushort *)((long)(this->normTrie->data).ptr0 + (long)(int)uVar11 * 2);
            pbVar22 = src;
            bVar9 = 6;
            if (0xfe01 < uVar4) {
              uVar6 = uVar4 >> 1;
              local_e0 = (byte)uVar14;
              pbVar22 = pbVar20;
              uVar14 = uVar6;
              bVar9 = 0;
              if (((byte)uVar6 < local_e0) &&
                 (pbVar22 = src, bVar9 = bVar7, sink == (ByteSink *)0x0)) {
                bVar16 = 0;
              }
            }
            src = pbVar22;
          } while (bVar9 == 0);
          if ((bVar9 == 6) &&
             ((uVar4 < this->minNoNoCompNoMaybeCC ||
              ((bVar9 = 0, this->limitNoNo <= uVar4 && (uVar4 < this->minMaybeYes)))))) {
            if (uVar4 < this->minNoNo) {
              src = pbVar20;
            }
            bVar9 = 3;
          }
LAB_001a9ea0:
          if (bVar9 == 0) goto LAB_001a9ea8;
        }
        else if (sink == (ByteSink *)0x0) {
          bVar9 = 1;
          bVar16 = 0;
        }
        else {
LAB_001a9ea8:
          bVar9 = 0;
        }
        if (bVar9 != 0) goto LAB_001a98d2;
      }
LAB_001aa069:
      pbVar20 = p;
      if ((local_f0 != p) &&
         ((this->minNoNoCompNoMaybeCC <= uVar3 &&
          ((uVar3 < this->limitNoNo || (this->minMaybeYes <= uVar3)))))) {
        pbVar22 = p + -1;
        bVar9 = p[-1];
        uVar11 = (uint)bVar9;
        if ((char)bVar9 < '\0') {
          uVar11 = ucptrie_internalU8PrevIndex_63(this->normTrie,(uint)bVar9,local_f0,pbVar22);
          pbVar22 = pbVar22 + -(ulong)(uVar11 & 7);
          uVar11 = (int)uVar11 >> 3;
        }
        uVar3 = *(ushort *)((long)(this->normTrie->data).ptr0 + (long)(int)uVar11 * 2);
        bVar23 = (uVar3 & 1) == 0;
        if (bVar23) {
          pbVar20 = pbVar22;
        }
        if (!bVar23 && onlyContiguous != '\0') {
          bVar23 = true;
          if (uVar3 != 1) {
            if (uVar3 < this->limitNoNo) {
              bVar23 = *(ushort *)((long)this->extraData + (ulong)(uVar3 & 0xfffffffe)) < 0x200;
            }
            else {
              bVar23 = (uVar3 & 6) < 3;
            }
          }
          pbVar20 = p;
          if (!bVar23) {
            pbVar20 = pbVar22;
          }
        }
      }
      local_b0.str = &local_70;
      local_b0.impl = this;
      local_b0.start = UnicodeString::getBuffer(local_b0.str,8);
      local_b0.remainingCapacity = 0x1b;
      if ((((local_b0.str)->fUnion).fStackFields.fLengthAndFlags & 2U) == 0) {
        local_b0.remainingCapacity = ((local_b0.str)->fUnion).fFields.fCapacity;
      }
      local_b0.lastCC = '\0';
      if ((local_b0.start == (char16_t *)0x0) && (*errorCode < U_ILLEGAL_ARGUMENT_ERROR)) {
        *errorCode = U_MEMORY_ALLOCATION_ERROR;
      }
      local_b0.reorderStart = local_b0.start;
      local_b0.limit = local_b0.start;
      bVar9 = 2;
      if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
        decomposeShort(this,pbVar20,src,'\0',onlyContiguous,&local_b0,errorCode);
        src = decomposeShort(this,src,limit,'\x01',onlyContiguous,&local_b0,errorCode);
        bVar9 = 2;
        if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
          if ((long)src - (long)pbVar20 < 0x80000000) {
            recompose(this,&local_b0,0,onlyContiguous);
            UVar8 = ReorderingBuffer::equals(&local_b0,pbVar20,src);
            if (UVar8 == '\0') {
              if (sink == (ByteSink *)0x0) {
                bVar16 = 0;
                bVar9 = 1;
              }
              else if ((local_f0 == pbVar20) ||
                      (UVar8 = ByteSinkUtil::appendUnchanged
                                         (local_f0,pbVar20,sink,options,edits,errorCode),
                      UVar8 != '\0')) {
                UVar8 = ByteSinkUtil::appendChange
                                  (pbVar20,src,local_b0.start,
                                   (int32_t)((ulong)((long)local_b0.limit - (long)local_b0.start) >>
                                            1),sink,edits,errorCode);
                if (UVar8 != '\0') {
                  local_f0 = src;
                }
                bVar9 = (UVar8 == '\0') * '\x02';
              }
            }
            else {
              bVar9 = 0;
            }
          }
          else {
            *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
            bVar16 = 1;
            bVar9 = 1;
          }
        }
      }
      ReorderingBuffer::~ReorderingBuffer(&local_b0);
    }
  }
LAB_001a98d2:
  if ((bVar9 != 0) && (bVar9 != 3)) {
    if (bVar9 == 2) {
      bVar16 = 1;
    }
    UnicodeString::~UnicodeString(&local_70);
    return bVar16;
  }
  goto joined_r0x001a9709;
}

Assistant:

UBool
Normalizer2Impl::composeUTF8(uint32_t options, UBool onlyContiguous,
                             const uint8_t *src, const uint8_t *limit,
                             ByteSink *sink, Edits *edits, UErrorCode &errorCode) const {
    U_ASSERT(limit != nullptr);
    UnicodeString s16;
    uint8_t minNoMaybeLead = leadByteForCP(minCompNoMaybeCP);
    const uint8_t *prevBoundary = src;

    for (;;) {
        // Fast path: Scan over a sequence of characters below the minimum "no or maybe" code point,
        // or with (compYes && ccc==0) properties.
        const uint8_t *prevSrc;
        uint16_t norm16 = 0;
        for (;;) {
            if (src == limit) {
                if (prevBoundary != limit && sink != nullptr) {
                    ByteSinkUtil::appendUnchanged(prevBoundary, limit,
                                                  *sink, options, edits, errorCode);
                }
                return TRUE;
            }
            if (*src < minNoMaybeLead) {
                ++src;
            } else {
                prevSrc = src;
                UCPTRIE_FAST_U8_NEXT(normTrie, UCPTRIE_16, src, limit, norm16);
                if (!isCompYesAndZeroCC(norm16)) {
                    break;
                }
            }
        }
        // isCompYesAndZeroCC(norm16) is false, that is, norm16>=minNoNo.
        // The current character is either a "noNo" (has a mapping)
        // or a "maybeYes" (combines backward)
        // or a "yesYes" with ccc!=0.
        // It is not a Hangul syllable or Jamo L because those have "yes" properties.

        // Medium-fast path: Handle cases that do not require full decomposition and recomposition.
        if (!isMaybeOrNonZeroCC(norm16)) {  // minNoNo <= norm16 < minMaybeYes
            if (sink == nullptr) {
                return FALSE;
            }
            // Fast path for mapping a character that is immediately surrounded by boundaries.
            // In this case, we need not decompose around the current character.
            if (isDecompNoAlgorithmic(norm16)) {
                // Maps to a single isCompYesAndZeroCC character
                // which also implies hasCompBoundaryBefore.
                if (norm16HasCompBoundaryAfter(norm16, onlyContiguous) ||
                        hasCompBoundaryBefore(src, limit)) {
                    if (prevBoundary != prevSrc &&
                            !ByteSinkUtil::appendUnchanged(prevBoundary, prevSrc,
                                                           *sink, options, edits, errorCode)) {
                        break;
                    }
                    appendCodePointDelta(prevSrc, src, getAlgorithmicDelta(norm16), *sink, edits);
                    prevBoundary = src;
                    continue;
                }
            } else if (norm16 < minNoNoCompBoundaryBefore) {
                // The mapping is comp-normalized which also implies hasCompBoundaryBefore.
                if (norm16HasCompBoundaryAfter(norm16, onlyContiguous) ||
                        hasCompBoundaryBefore(src, limit)) {
                    if (prevBoundary != prevSrc &&
                            !ByteSinkUtil::appendUnchanged(prevBoundary, prevSrc,
                                                           *sink, options, edits, errorCode)) {
                        break;
                    }
                    const uint16_t *mapping = getMapping(norm16);
                    int32_t length = *mapping++ & MAPPING_LENGTH_MASK;
                    if (!ByteSinkUtil::appendChange(prevSrc, src, (const UChar *)mapping, length,
                                                    *sink, edits, errorCode)) {
                        break;
                    }
                    prevBoundary = src;
                    continue;
                }
            } else if (norm16 >= minNoNoEmpty) {
                // The current character maps to nothing.
                // Simply omit it from the output if there is a boundary before _or_ after it.
                // The character itself implies no boundaries.
                if (hasCompBoundaryBefore(src, limit) ||
                        hasCompBoundaryAfter(prevBoundary, prevSrc, onlyContiguous)) {
                    if (prevBoundary != prevSrc &&
                            !ByteSinkUtil::appendUnchanged(prevBoundary, prevSrc,
                                                           *sink, options, edits, errorCode)) {
                        break;
                    }
                    if (edits != nullptr) {
                        edits->addReplace((int32_t)(src - prevSrc), 0);
                    }
                    prevBoundary = src;
                    continue;
                }
            }
            // Other "noNo" type, or need to examine more text around this character:
            // Fall through to the slow path.
        } else if (isJamoVT(norm16)) {
            // Jamo L: E1 84 80..92
            // Jamo V: E1 85 A1..B5
            // Jamo T: E1 86 A8..E1 87 82
            U_ASSERT((src - prevSrc) == 3 && *prevSrc == 0xe1);
            UChar32 prev = previousHangulOrJamo(prevBoundary, prevSrc);
            if (prevSrc[1] == 0x85) {
                // The current character is a Jamo Vowel,
                // compose with previous Jamo L and following Jamo T.
                UChar32 l = prev - Hangul::JAMO_L_BASE;
                if ((uint32_t)l < Hangul::JAMO_L_COUNT) {
                    if (sink == nullptr) {
                        return FALSE;
                    }
                    int32_t t = getJamoTMinusBase(src, limit);
                    if (t >= 0) {
                        // The next character is a Jamo T.
                        src += 3;
                    } else if (hasCompBoundaryBefore(src, limit)) {
                        // No Jamo T follows, not even via decomposition.
                        t = 0;
                    }
                    if (t >= 0) {
                        UChar32 syllable = Hangul::HANGUL_BASE +
                            (l*Hangul::JAMO_V_COUNT + (prevSrc[2]-0xa1)) *
                            Hangul::JAMO_T_COUNT + t;
                        prevSrc -= 3;  // Replace the Jamo L as well.
                        if (prevBoundary != prevSrc &&
                                !ByteSinkUtil::appendUnchanged(prevBoundary, prevSrc,
                                                               *sink, options, edits, errorCode)) {
                            break;
                        }
                        ByteSinkUtil::appendCodePoint(prevSrc, src, syllable, *sink, edits);
                        prevBoundary = src;
                        continue;
                    }
                    // If we see L+V+x where x!=T then we drop to the slow path,
                    // decompose and recompose.
                    // This is to deal with NFKC finding normal L and V but a
                    // compatibility variant of a T.
                    // We need to either fully compose that combination here
                    // (which would complicate the code and may not work with strange custom data)
                    // or use the slow path.
                }
            } else if (Hangul::isHangulLV(prev)) {
                // The current character is a Jamo Trailing consonant,
                // compose with previous Hangul LV that does not contain a Jamo T.
                if (sink == nullptr) {
                    return FALSE;
                }
                UChar32 syllable = prev + getJamoTMinusBase(prevSrc, src);
                prevSrc -= 3;  // Replace the Hangul LV as well.
                if (prevBoundary != prevSrc &&
                        !ByteSinkUtil::appendUnchanged(prevBoundary, prevSrc,
                                                       *sink, options, edits, errorCode)) {
                    break;
                }
                ByteSinkUtil::appendCodePoint(prevSrc, src, syllable, *sink, edits);
                prevBoundary = src;
                continue;
            }
            // No matching context, or may need to decompose surrounding text first:
            // Fall through to the slow path.
        } else if (norm16 > JAMO_VT) {  // norm16 >= MIN_YES_YES_WITH_CC
            // One or more combining marks that do not combine-back:
            // Check for canonical order, copy unchanged if ok and
            // if followed by a character with a boundary-before.
            uint8_t cc = getCCFromNormalYesOrMaybe(norm16);  // cc!=0
            if (onlyContiguous /* FCC */ && getPreviousTrailCC(prevBoundary, prevSrc) > cc) {
                // Fails FCD test, need to decompose and contiguously recompose.
                if (sink == nullptr) {
                    return FALSE;
                }
            } else {
                // If !onlyContiguous (not FCC), then we ignore the tccc of
                // the previous character which passed the quick check "yes && ccc==0" test.
                const uint8_t *nextSrc;
                uint16_t n16;
                for (;;) {
                    if (src == limit) {
                        if (sink != nullptr) {
                            ByteSinkUtil::appendUnchanged(prevBoundary, limit,
                                                          *sink, options, edits, errorCode);
                        }
                        return TRUE;
                    }
                    uint8_t prevCC = cc;
                    nextSrc = src;
                    UCPTRIE_FAST_U8_NEXT(normTrie, UCPTRIE_16, nextSrc, limit, n16);
                    if (n16 >= MIN_YES_YES_WITH_CC) {
                        cc = getCCFromNormalYesOrMaybe(n16);
                        if (prevCC > cc) {
                            if (sink == nullptr) {
                                return FALSE;
                            }
                            break;
                        }
                    } else {
                        break;
                    }
                    src = nextSrc;
                }
                // src is after the last in-order combining mark.
                // If there is a boundary here, then we continue with no change.
                if (norm16HasCompBoundaryBefore(n16)) {
                    if (isCompYesAndZeroCC(n16)) {
                        src = nextSrc;
                    }
                    continue;
                }
                // Use the slow path. There is no boundary in [prevSrc, src[.
            }
        }

        // Slow path: Find the nearest boundaries around the current character,
        // decompose and recompose.
        if (prevBoundary != prevSrc && !norm16HasCompBoundaryBefore(norm16)) {
            const uint8_t *p = prevSrc;
            UCPTRIE_FAST_U8_PREV(normTrie, UCPTRIE_16, prevBoundary, p, norm16);
            if (!norm16HasCompBoundaryAfter(norm16, onlyContiguous)) {
                prevSrc = p;
            }
        }
        ReorderingBuffer buffer(*this, s16, errorCode);
        if (U_FAILURE(errorCode)) {
            break;
        }
        // We know there is not a boundary here.
        decomposeShort(prevSrc, src, FALSE /* !stopAtCompBoundary */, onlyContiguous,
                       buffer, errorCode);
        // Decompose until the next boundary.
        src = decomposeShort(src, limit, TRUE /* stopAtCompBoundary */, onlyContiguous,
                             buffer, errorCode);
        if (U_FAILURE(errorCode)) {
            break;
        }
        if ((src - prevSrc) > INT32_MAX) {  // guard before buffer.equals()
            errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
            return TRUE;
        }
        recompose(buffer, 0, onlyContiguous);
        if (!buffer.equals(prevSrc, src)) {
            if (sink == nullptr) {
                return FALSE;
            }
            if (prevBoundary != prevSrc &&
                    !ByteSinkUtil::appendUnchanged(prevBoundary, prevSrc,
                                                   *sink, options, edits, errorCode)) {
                break;
            }
            if (!ByteSinkUtil::appendChange(prevSrc, src, buffer.getStart(), buffer.length(),
                                            *sink, edits, errorCode)) {
                break;
            }
            prevBoundary = src;
        }
    }
    return TRUE;
}